

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O0

AdsHandle * __thiscall
AdsDevice::GetHandle(AdsHandle *__return_storage_ptr__,AdsDevice *this,string *symbolName)

{
  size_t writeLength;
  void *writeData;
  long lVar1;
  AdsException *this_00;
  pointer __p;
  AdsDevice *local_b0;
  code *local_a8;
  undefined8 local_a0;
  type local_98;
  function<long_(unsigned_int)> local_80;
  ResourceDeleter<unsigned_int> local_60;
  uint local_2c;
  uint32_t local_28;
  uint32_t error;
  uint32_t bytesRead;
  uint32_t handle;
  string *symbolName_local;
  AdsDevice *this_local;
  
  error = 0;
  local_28 = 0;
  _bytesRead = symbolName;
  symbolName_local = (string *)this;
  this_local = (AdsDevice *)__return_storage_ptr__;
  writeLength = std::__cxx11::string::size();
  writeData = (void *)std::__cxx11::string::c_str();
  lVar1 = ReadWriteReqEx2(this,0xf003,0,4,&error,writeLength,writeData,&local_28);
  local_2c = (uint)lVar1;
  if ((local_2c == 0) && (local_28 == 4)) {
    error = bhf::ads::letoh<unsigned_int>(&error);
    __p = (pointer)operator_new(4);
    *__p = error;
    local_a8 = DeleteSymbolHandle;
    local_a0 = 0;
    local_b0 = this;
    std::bind<long(AdsDevice::*)(unsigned_int)const,AdsDevice_const*,std::_Placeholder<1>const&>
              (&local_98,(offset_in_AdsDevice_to_subr *)&local_a8,&local_b0,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<long(unsigned_int)>::
    function<std::_Bind<long(AdsDevice::*(AdsDevice_const*,std::_Placeholder<1>))(unsigned_int)const>,void>
              ((function<long(unsigned_int)> *)&local_80,&local_98);
    ResourceDeleter<unsigned_int>::ResourceDeleter(&local_60,&local_80);
    std::unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>>::
    unique_ptr<ResourceDeleter<unsigned_int>,void>
              ((unique_ptr<unsigned_int,ResourceDeleter<unsigned_int>> *)__return_storage_ptr__,__p,
               &local_60);
    ResourceDeleter<unsigned_int>::~ResourceDeleter(&local_60);
    std::function<long_(unsigned_int)>::~function(&local_80);
    return __return_storage_ptr__;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,(ulong)local_2c);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

AdsHandle AdsDevice::GetHandle(const std::string& symbolName) const
{
    uint32_t handle = 0;
    uint32_t bytesRead = 0;
    uint32_t error = ReadWriteReqEx2(
        ADSIGRP_SYM_HNDBYNAME, 0,
        sizeof(handle), &handle,
        symbolName.size(),
        symbolName.c_str(),
        &bytesRead
        );

    if (error || (sizeof(handle) != bytesRead)) {
        throw AdsException(error);
    }

    handle = bhf::ads::letoh(handle);
    return {new uint32_t {handle}, {std::bind(&AdsDevice::DeleteSymbolHandle, this, std::placeholders::_1)}};
}